

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O3

void MultiPCM_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  DEV_SMPL smpr;
  DEV_SMPL DVar9;
  uint uVar10;
  INT32 IVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  DEV_SMPL smpl;
  DEV_SMPL DVar16;
  
  lVar5 = *(long *)((long)info + 0x2650);
  if (lVar5 == 0) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  if (samples != 0) {
    uVar15 = 0;
    do {
      lVar13 = 0;
      DVar16 = 0;
      DVar9 = 0;
      do {
        if ((*(char *)((long)info + lVar13 + 0x10) != '\0') &&
           (*(char *)((long)info + lVar13 + 0xb9) == '\0')) {
          uVar8 = *(uint *)((long)info + lVar13 + 0x30);
          uVar10 = uVar8 >> 0xc;
          if (*(char *)((long)info + lVar13 + 0x3c) != '\0') {
            uVar10 = ~uVar10 + *(int *)((long)info + lVar13 + 0x1c);
          }
          if ((*(byte *)((long)info + lVar13 + 0x28) & 4) != 0) break;
          uVar7 = *(uint *)((long)info + lVar13 + 0x38);
          bVar1 = *(byte *)(lVar5 + (ulong)(*(int *)((long)info + lVar13 + 0x2c) + uVar10 &
                                           *(uint *)((long)info + 0x2648)));
          if (*(char *)((long)info + lVar13 + 0x98) != '\0') {
            sVar6 = *(short *)((long)info + lVar13 + 0x80) + *(short *)((long)info + lVar13 + 0x84);
            *(short *)((long)info + lVar13 + 0x80) = sVar6;
            uVar7 = uVar7 * *(int *)(*(long *)((long)info + lVar13 + 0x90) +
                                    (long)*(int *)(*(long *)((long)info + lVar13 + 0x88) +
                                                  (ulong)(byte)((ushort)sVar6 >> 8) * 4) * 4) >> 8 &
                    0xfffff;
          }
          uVar2 = *(uint *)((long)info + lVar13 + 0x44);
          uVar7 = uVar7 + uVar8;
          iVar14 = *(int *)((long)info + lVar13 + 0x50);
          *(uint *)((long)info + lVar13 + 0x30) = uVar7;
          iVar12 = *(int *)((long)info + lVar13 + 0x1c);
          if ((uint)(iVar12 << 0xc) <= uVar7) {
            uVar7 = uVar7 + (*(int *)((long)info + lVar13 + 0x18) - iVar12) * 0x1000;
            *(uint *)((long)info + lVar13 + 0x30) = uVar7;
            *(undefined1 *)((long)info + lVar13 + 0x3c) = 0;
          }
          iVar12 = (int)(short)((ushort)bVar1 << 8);
          if (uVar10 != uVar7 >> 0xc) {
            *(int *)((long)info + lVar13 + 0x50) = iVar12;
          }
          uVar10 = uVar2 >> 0xc;
          if (uVar10 != *(uint *)((long)info + lVar13 + 0x48)) {
            *(uint *)((long)info + lVar13 + 0x44) = uVar2 + *(int *)((long)info + lVar13 + 0x4c);
          }
          iVar14 = (int)((uVar8 & 0xfff) * iVar12 + (0x1000 - (uVar8 & 0xfff)) * iVar14) >> 0xc;
          if (*(char *)((long)info + lVar13 + 0xb8) != '\0') {
            sVar6 = *(short *)((long)info + lVar13 + 0xa0) + *(short *)((long)info + lVar13 + 0xa4);
            *(short *)((long)info + lVar13 + 0xa0) = sVar6;
            iVar14 = iVar14 * *(int *)(*(long *)((long)info + lVar13 + 0xb0) +
                                      (long)*(int *)(*(long *)((long)info + lVar13 + 0xa8) +
                                                    (ulong)(byte)((ushort)sVar6 >> 8) * 4) * 4) *
                     0x10 >> 0xc;
          }
          switch(*(undefined4 *)((long)info + lVar13 + 0x58)) {
          case 0:
            uVar8 = *(int *)((long)info + lVar13 + 0x54) + *(int *)((long)info + lVar13 + 100);
            *(uint *)((long)info + lVar13 + 0x54) = uVar8;
            if (0x3feffff < (int)uVar8) {
              *(uint *)((long)info + lVar13 + 0x58) =
                   (0x3ffffff < *(int *)((long)info + lVar13 + 0x68)) + 1;
              *(undefined4 *)((long)info + lVar13 + 0x54) = 0x3ff0000;
              uVar8 = 0x3ff0000;
            }
            goto LAB_001609c3;
          case 1:
            uVar8 = *(int *)((long)info + lVar13 + 0x54) - *(int *)((long)info + lVar13 + 0x68);
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            *(uint *)((long)info + lVar13 + 0x54) = uVar8;
            if ((int)(uVar8 >> 0x16) <= *(int *)((long)info + lVar13 + 0x74)) {
              *(undefined4 *)((long)info + lVar13 + 0x58) = 2;
            }
            break;
          case 2:
            uVar8 = *(int *)((long)info + lVar13 + 0x54) - *(int *)((long)info + lVar13 + 0x6c);
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            *(uint *)((long)info + lVar13 + 0x54) = uVar8;
            break;
          case 3:
            iVar12 = *(int *)((long)info + lVar13 + 0x54);
            iVar3 = *(int *)((long)info + lVar13 + 0x70);
            uVar8 = iVar12 - iVar3;
            *(uint *)((long)info + lVar13 + 0x54) = uVar8;
            if (uVar8 == 0 || iVar12 < iVar3) {
              *(undefined4 *)((long)info + lVar13 + 0x54) = 0;
              *(undefined1 *)((long)info + lVar13 + 0x10) = 0;
              uVar8 = 0;
            }
            break;
          default:
            IVar11 = 0x1000;
            goto LAB_001609d4;
          }
          if ((*(char *)((long)info + lVar13 + 0x5c) != '\0') && (uVar8 < 0x3010000)) {
            uVar4 = *(undefined4 *)((long)info + 0x1584);
            *(undefined4 *)((long)info + lVar13 + 0x68) = uVar4;
            *(undefined4 *)((long)info + lVar13 + 0x6c) = uVar4;
            *(undefined4 *)((long)info + lVar13 + 0x70) = uVar4;
          }
LAB_001609c3:
          IVar11 = linear_to_exp_volume[(int)uVar8 >> 0x10];
LAB_001609d4:
          uVar10 = *(int *)((long)info + lVar13 + 0x40) << 7 | uVar10;
          iVar14 = IVar11 * iVar14 >> 10;
          DVar16 = DVar16 + (left_pan_table[uVar10] * iVar14 >> 0xc);
          DVar9 = DVar9 + (iVar14 * right_pan_table[uVar10] >> 0xc);
        }
        lVar13 = lVar13 + 0xb8;
      } while (lVar13 != 0x1420);
      (*outputs)[uVar15] = DVar16;
      outputs[1][uVar15] = DVar9;
      uVar15 = uVar15 + 1;
    } while (uVar15 != samples);
  }
  return;
}

Assistant:

static void MultiPCM_update(void *info, UINT32 samples, DEV_SMPL **outputs)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	UINT32 i, sl;

	if (ptChip->ROM == NULL)
	{
		memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
		memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
		return;
	}

	for (i = 0; i < samples; ++i)
	{
		DEV_SMPL smpl = 0;
		DEV_SMPL smpr = 0;
		for (sl = 0; sl < 28; ++sl)
		{
			slot_t *slot = &ptChip->slots[sl];
			if (slot->playing && ! slot->muted)
			{
				UINT32 vol = (slot->total_level >> TL_SHIFT) | (slot->pan << 7);
				UINT32 spos = slot->offset >> TL_SHIFT;
				UINT32 step = slot->step;
				INT32 csample;
				INT32 fpart = slot->offset & ((1 << TL_SHIFT) - 1);
				INT32 sample;

				if (slot->reverse)
				{
					spos = slot->sample.end - spos - 1;
				}

				if (slot->sample.format & 4)	// 12-bit linear
				{
					UINT32 adr = slot->base + (spos >> 1) * 3;
					if (!(spos & 1))
					{ // ab.c ..
						INT16 w0 = (read_byte(ptChip, adr) << 8) | ((read_byte(ptChip, adr + 1) & 0xf) << 4);
						csample = w0;
						break;
					}
					else
					{ // ..C. AB
						INT16 w0 = (read_byte(ptChip, adr + 2) << 8) | (read_byte(ptChip, adr + 1) & 0xf0);
						csample = w0;
						break;
					}
				}
				else
				{
					csample = (INT16)(read_byte(ptChip, slot->base + spos) << 8);
				}

				sample = (csample * fpart + slot->prev_sample * ((1 << TL_SHIFT) - fpart)) >> TL_SHIFT;

				if (slot->vibrato) // Vibrato enabled
				{
					step = step * pitch_lfo_step(&slot->pitch_lfo);
					step >>= TL_SHIFT;
				}

				slot->offset += step;
				if (slot->offset >= (slot->sample.end << TL_SHIFT))
				{
					slot->offset -= (slot->sample.end - slot->sample.loop) << TL_SHIFT;
					// DD-9 expects the looped silence at the end of some samples to be the same whether reversed or not
					slot->reverse = false;
				}

				if (spos ^ (slot->offset >> TL_SHIFT))
				{
					slot->prev_sample = csample;
				}

				if ((slot->total_level >> TL_SHIFT) != slot->dest_total_level)
				{
					slot->total_level += slot->total_level_step;
				}

				if (slot->tremolo) // Tremolo enabled
				{
					sample = sample * amplitude_lfo_step(&slot->amplitude_lfo);
					sample >>= TL_SHIFT;
				}

				sample = (sample * envelope_generator_update(ptChip, slot)) >> 10;

				smpl += (left_pan_table[vol] * sample) >> TL_SHIFT;
				smpr += (right_pan_table[vol] * sample) >> TL_SHIFT;
			}
		}

		outputs[0][i] = smpl;
		outputs[1][i] = smpr;
	}
}